

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_seed.c
# Opt level: O0

int seed_from_timestamp_and_pid(uint32_t *seed)

{
  time_t tVar1;
  uint32_t *seed_local;
  
  tVar1 = time((time_t *)0x0);
  *seed = (uint32_t)tVar1;
  return 0;
}

Assistant:

static int seed_from_timestamp_and_pid(uint32_t *seed) {
#ifdef HAVE_GETTIMEOFDAY
    /* XOR of seconds and microseconds */
    struct timeval tv;
    gettimeofday(&tv, NULL);
    *seed = (uint32_t)tv.tv_sec ^ (uint32_t)tv.tv_usec;
#else
    /* Seconds only */
    *seed = (uint32_t) time(NULL);
#endif

    /* XOR with PID for more randomness */
#if defined(_WIN32)
    *seed ^= (uint32_t)GetCurrentProcessId();
#elif defined(HAVE_GETPID)
    *seed ^= (uint32_t)getpid();
#endif

    return 0;
}